

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

QSizeF __thiscall QItemDelegatePrivate::doTextLayout(QItemDelegatePrivate *this,int lineWidth)

{
  QSizeF QVar1;
  double dVar2;
  undefined4 uVar3;
  qreal extraout_RDX;
  qreal extraout_RDX_00;
  long in_FS_OFFSET;
  double dVar4;
  double local_58;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::beginLayout();
  local_38.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  uVar3 = QTextLayout::createLine();
  local_38.xp = (qreal)CONCAT44(local_38.xp._4_4_,uVar3);
  if (extraout_RDX == 0.0) {
    dVar4 = 0.0;
    local_58 = 0.0;
  }
  else {
    local_58 = 0.0;
    local_38.yp = extraout_RDX;
    dVar2 = 0.0;
    do {
      QTextLine::setLineWidth((double)lineWidth);
      QTextLine::setPosition(&local_38);
      dVar4 = (double)QTextLine::height();
      local_58 = local_58 + dVar4;
      dVar4 = (double)QTextLine::naturalTextWidth();
      if (dVar4 <= dVar2) {
        dVar4 = dVar2;
      }
      local_38.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_38.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      uVar3 = QTextLayout::createLine();
      local_38.xp = (qreal)CONCAT44(local_38.xp._4_4_,uVar3);
      local_38.yp = extraout_RDX_00;
      dVar2 = dVar4;
    } while (extraout_RDX_00 != 0.0);
  }
  local_38.yp = 0.0;
  QTextLayout::endLayout();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  QVar1.ht = local_58;
  QVar1.wd = dVar4;
  return QVar1;
}

Assistant:

QSizeF QItemDelegatePrivate::doTextLayout(int lineWidth) const
{
    qreal height = 0;
    qreal widthUsed = 0;
    textLayout.beginLayout();
    while (true) {
        QTextLine line = textLayout.createLine();
        if (!line.isValid())
            break;
        line.setLineWidth(lineWidth);
        line.setPosition(QPointF(0, height));
        height += line.height();
        widthUsed = qMax(widthUsed, line.naturalTextWidth());
    }
    textLayout.endLayout();
    return QSizeF(widthUsed, height);
}